

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall embree::Scene::commit_task(Scene *this)

{
  _func_int **pp_Var1;
  size_t sVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  bool bVar5;
  char cVar6;
  task *ptVar7;
  runtime_error *prVar8;
  uint uVar9;
  unsigned_long end;
  size_t geomID;
  size_t sVar10;
  uint uVar11;
  plus<embree::GeometryCounts> local_35a;
  auto_partitioner local_359;
  small_object_pool *local_358;
  anon_class_8_1_8991fb9c local_350;
  anon_class_16_2_ed117de8_conflict7 local_348;
  anon_class_24_3_8ee612a4_conflict1 local_338;
  task_group_context context;
  GeometryCounts v;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_embree::GeometryCounts,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_______common_algorithms_parallel_reduce_h:59:7),_std::plus<embree::GeometryCounts>_>
  body;
  GeometryCounts local_f8;
  
  checkIfModifiedAndSet(this);
  if (this->modified == true) {
    bVar5 = State::verbosity(*(State **)&(this->super_AccelN).field_0x188,2);
    if (bVar5) {
      printStatistics(this);
    }
    LOCK();
    (this->progress_monitor_counter).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pp_Var1 = (_func_int **)(this->geometries).size_active;
    memset(&local_f8,0,200);
    local_338.func = &local_350;
    local_350.this = this;
    local_338.identity = &local_f8;
    local_338.reduction = &local_35a;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    body.my_real_body = &local_348;
    local_348.reduction = &local_35a;
    local_348.func = &local_338;
    body.my_identity_element = &local_f8;
    body.my_reduction = &local_35a;
    memcpy(&body.my_value,&local_f8,200);
    if (pp_Var1 != (_func_int **)0x0) {
      v.numFilterFunctions = 0;
      v.numTriangles._0_4_ = 1;
      v.numMBTriangles = 1;
      v.numQuads = 1;
      local_358 = (small_object_pool *)0x0;
      ptVar7 = (task *)tbb::detail::r1::allocate(&local_358,0xc0);
      ptVar7->m_reserved[3] = 0;
      ptVar7->m_reserved[4] = 0;
      ptVar7->m_reserved[1] = 0;
      ptVar7->m_reserved[2] = 0;
      ptVar7->m_reserved[5] = 0;
      (ptVar7->super_task_traits).m_version_and_traits = 0;
      ptVar7->m_reserved[0] = 0;
      ptVar7->_vptr_task = (_func_int **)&PTR__task_021d4808;
      ptVar7[1]._vptr_task = pp_Var1;
      ptVar7[1].super_task_traits.m_version_and_traits = 0;
      ptVar7[1].m_reserved[0] = 1;
      ptVar7[1].m_reserved[1] = (uint64_t)&body;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar7[1].m_reserved + 3),&local_359);
      ptVar7[1].m_reserved[5] = (uint64_t)local_358;
      *(undefined1 *)&ptVar7[2]._vptr_task = 0;
      ptVar7[1].m_reserved[2] = (uint64_t)&v;
      tbb::detail::r1::execute_and_wait(ptVar7,&context,(wait_context *)&v.numMBTriangles,&context);
    }
    memcpy(&v,&body.my_value,200);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar6 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    memcpy(&this->world,&v,200);
    this->maxTimeSegments = 1;
    sVar2 = (this->geometries).size_active;
    pRVar3 = (this->geometries).items;
    uVar9 = 1;
    for (sVar10 = 0; sVar2 != sVar10; sVar10 = sVar10 + 1) {
      pGVar4 = pRVar3[sVar10].ptr;
      if (pGVar4 != (Geometry *)0x0) {
        uVar11 = pGVar4->numTimeSteps - 1;
        if (uVar9 <= uVar11) {
          uVar9 = uVar11;
        }
        this->maxTimeSegments = uVar9;
      }
    }
    build_cpu_accels(this);
    pp_Var1 = (_func_int **)(this->geometries).size_active;
    local_338.identity = (GeometryCounts *)this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&body,(context_traits)0x4,CUSTOM_CTX);
    context.my_cpu_ctl_env = (uint64_t)&local_338;
    if (pp_Var1 != (_func_int **)0x0) {
      local_f8.numFilterFunctions = 0;
      ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_f8,0xc0);
      ptVar7->m_reserved[3] = 0;
      ptVar7->m_reserved[4] = 0;
      ptVar7->m_reserved[1] = 0;
      ptVar7->m_reserved[2] = 0;
      ptVar7->m_reserved[5] = 0;
      (ptVar7->super_task_traits).m_version_and_traits = 0;
      ptVar7->m_reserved[0] = 0;
      ptVar7->_vptr_task = (_func_int **)&PTR__task_021d4850;
      ptVar7[1]._vptr_task = pp_Var1;
      ptVar7[1].super_task_traits.m_version_and_traits = 0;
      ptVar7[1].m_reserved[0] = 1;
      ptVar7[1].m_reserved[1] = (uint64_t)&context;
      ptVar7[1].m_reserved[2] = 0;
      ptVar7[1].m_reserved[3] = 1;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar7[1].m_reserved + 5),(auto_partitioner *)&local_348);
      ptVar7[2].super_task_traits.m_version_and_traits = local_f8.numFilterFunctions;
      v.numFilterFunctions = 0;
      v.numTriangles._0_4_ = 1;
      v.numMBTriangles = 1;
      v.numQuads = 1;
      ptVar7[1].m_reserved[4] = (uint64_t)&v;
      tbb::detail::r1::execute_and_wait
                (ptVar7,(task_group_context *)&body,(wait_context *)&v.numMBTriangles,
                 (task_group_context *)&body);
    }
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&body);
    if (cVar6 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&body);
    this->modified = false;
  }
  return;
}

Assistant:

void Scene::commit_task ()
  {
    checkIfModifiedAndSet();
    if (!isModified()) return;
    

    /* print scene statistics */
    if (device->verbosity(2))
      printStatistics();

    progress_monitor_counter = 0;
    
    /* gather scene stats and call preCommit function of each geometry */
    this->world = parallel_reduce (size_t(0), geometries.size(), GeometryCounts (), 
      [this](const range<size_t>& r)->GeometryCounts
      {
        GeometryCounts c;
        for (auto i=r.begin(); i<r.end(); ++i) 
        {
          if (geometries[i] && geometries[i]->isEnabled()) 
          {
            geometries[i]->preCommit();
            geometries[i]->addElementsToCount (c);
            c.numFilterFunctions += (int) geometries[i]->hasArgumentFilterFunctions();
            c.numFilterFunctions += (int) geometries[i]->hasGeometryFilterFunctions();
          }
        }
        return c;
      },
      std::plus<GeometryCounts>()
    );

    /* calculate maximal number of motion blur time segments in scene */
    maxTimeSegments = 1;
    for (size_t geomID=0; geomID<size(); geomID++)
    {
      Geometry* geom = get(geomID);
      if (geom == nullptr) continue;
      maxTimeSegments = std::max(maxTimeSegments, geom->numTimeSegments());
    }

#if defined(EMBREE_SYCL_SUPPORT)
    DeviceGPU* gpu_device = dynamic_cast<DeviceGPU*>(device);
    if (gpu_device)
      build_gpu_accels();
    else
#endif
      build_cpu_accels();

    /* call postCommit function of each geometry */
    parallel_for(geometries.size(), [&] ( const size_t i ) {
        if (geometries[i] && geometries[i]->isEnabled()) {
          geometries[i]->postCommit();
          vertices[i] = geometries[i]->getCompactVertexArray();
          geometryModCounters_[i] = geometries[i]->getModCounter();
        }
      });

    setModified(false);
  }